

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::sortByColumn(QTableView *this,int column,SortOrder order)

{
  long lVar1;
  int iVar2;
  SortOrder SVar3;
  
  if (-2 < column) {
    lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
    QHeaderView::setSortIndicator(*(QHeaderView **)(lVar1 + 0x580),column,order);
    if (*(char *)(lVar1 + 0x640) != '\x01') {
LAB_0058acbe:
      (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x140))(*(long **)(lVar1 + 0x2f8),column,order);
      return;
    }
    iVar2 = QHeaderView::sortIndicatorSection(*(QHeaderView **)(lVar1 + 0x580));
    if (iVar2 == column) {
      SVar3 = QHeaderView::sortIndicatorOrder(*(QHeaderView **)(lVar1 + 0x580));
      if (SVar3 == order) goto LAB_0058acbe;
    }
  }
  return;
}

Assistant:

void QTableView::sortByColumn(int column, Qt::SortOrder order)
{
    Q_D(QTableView);
    if (column < -1)
        return;
    d->horizontalHeader->setSortIndicator(column, order);
    // If sorting is not enabled or has the same order as before, force to sort now
    // else sorting will be trigger through sortIndicatorChanged()
    if (!d->sortingEnabled ||
        (d->horizontalHeader->sortIndicatorSection() == column && d->horizontalHeader->sortIndicatorOrder() == order))
        d->model->sort(column, order);
}